

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueList::read(PLYValueList *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  size_type sVar2;
  PLYValue *pPVar3;
  reference ppPVar4;
  undefined4 in_register_00000034;
  size_t i_1;
  size_t i;
  ply_encoding in_stack_00000088;
  ply_type in_stack_0000008c;
  vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_> *in_stack_ffffffffffffffe0;
  ulong uVar5;
  ulong local_18;
  
  (*this->size->_vptr_PLYValue[2])(this->size,CONCAT44(in_register_00000034,__fd));
  uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
  uVar5 = (ulong)uVar1;
  sVar2 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::size(&this->list);
  if (sVar2 < uVar5) {
    sVar2 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::size(&this->list);
    this->used = sVar2;
    (*this->size->_vptr_PLYValue[5])(this->size,0);
    std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::resize
              (in_stack_ffffffffffffffe0,uVar5);
    for (local_18 = this->used;
        sVar2 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::size(&this->list),
        local_18 < sVar2; local_18 = local_18 + 1) {
      pPVar3 = createValue(in_stack_0000008c,in_stack_00000088);
      ppPVar4 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::operator[]
                          (&this->list,local_18);
      *ppPVar4 = pPVar3;
    }
  }
  uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
  this->used = (ulong)uVar1;
  for (uVar5 = 0; uVar5 < this->used; uVar5 = uVar5 + 1) {
    ppPVar4 = std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::operator[]
                        (&this->list,uVar5);
    (*(*ppPVar4)->_vptr_PLYValue[2])(*ppPVar4,CONCAT44(in_register_00000034,__fd));
  }
  return uVar5;
}

Assistant:

void read(std::streambuf *in)
    {
      size->read(in);

      if (size->getUnsignedInt() > list.size())
      {
        used=list.size();
        list.resize(size->getUnsignedInt());

        for (size_t i=used; i<list.size(); i++)
        {
          list[i]=createValue(tvalue, enc);
        }
      }

      used=size->getUnsignedInt();

      for (size_t i=0; i<used; i++)
      {
        list[i]->read(in);
      }
    }